

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QString * systemFallbackThemeName(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGuiApplicationPrivate::platform_theme != (QPlatformTheme *)0x0) {
    local_38._16_4_ = 0xaaaaaaaa;
    local_38._20_4_ = 0xaaaaaaaa;
    uStack_20 = 0xaaaaaaaa;
    uStack_1c = 0xaaaaaaaa;
    local_38._0_4_ = 0xaaaaaaaa;
    local_38._4_4_ = 0xaaaaaaaa;
    local_38._8_4_ = 0xaaaaaaaa;
    local_38._12_4_ = 0xaaaaaaaa;
    (*QGuiApplicationPrivate::platform_theme->_vptr_QPlatformTheme[0xc])
              (&local_38,QGuiApplicationPrivate::platform_theme,0xf);
    if (3 < CONCAT44(uStack_1c,uStack_20)) {
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_38);
      goto LAB_0025f7a0;
    }
    QVariant::~QVariant((QVariant *)&local_38);
  }
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (char16_t *)0x0;
  (in_RDI->d).size = 0;
LAB_0025f7a0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString systemFallbackThemeName()
{
    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
        const QVariant themeHint = theme->themeHint(QPlatformTheme::SystemIconFallbackThemeName);
        if (themeHint.isValid())
            return themeHint.toString();
    }
    return QString();
}